

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BipartiteGraph.cpp
# Opt level: O2

vector<std::deque<bool,_std::allocator<bool>_>,_std::allocator<std::deque<bool,_std::allocator<bool>_>_>_>
* BipartiteGraph::getIncidenceMatrix
            (vector<std::deque<bool,_std::allocator<bool>_>,_std::allocator<std::deque<bool,_std::allocator<bool>_>_>_>
             *__return_storage_ptr__,vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *edges1,
            vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *edges2)

{
  pointer pPVar1;
  pointer pPVar2;
  bool bVar3;
  reference pbVar4;
  ulong uVar5;
  size_t j;
  ulong __n;
  long lVar6;
  allocator_type local_a3;
  allocator_type local_a2;
  value_type local_a1;
  vector<std::deque<bool,_std::allocator<bool>_>,_std::allocator<std::deque<bool,_std::allocator<bool>_>_>_>
  *local_a0;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *local_98;
  ulong local_90;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *local_88;
  _Deque_base<bool,_std::allocator<bool>_> local_80;
  
  pPVar1 = (edges1->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pPVar2 = (edges1->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  local_a1 = false;
  local_98 = edges1;
  local_88 = edges2;
  std::deque<bool,_std::allocator<bool>_>::deque
            ((deque<bool,_std::allocator<bool>_> *)&local_80,
             ((long)(edges2->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)(edges2->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>).
                   _M_impl.super__Vector_impl_data._M_start) / 0x48,&local_a1,&local_a2);
  std::
  vector<std::deque<bool,_std::allocator<bool>_>,_std::allocator<std::deque<bool,_std::allocator<bool>_>_>_>
  ::vector(__return_storage_ptr__,((long)pPVar2 - (long)pPVar1) / 0x48,(value_type *)&local_80,
           &local_a3);
  std::_Deque_base<bool,_std::allocator<bool>_>::~_Deque_base(&local_80);
  uVar5 = 0;
  local_a0 = __return_storage_ptr__;
  while (uVar5 < (ulong)(((long)(local_98->
                                super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>).
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(local_98->
                               super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>).
                               _M_impl.super__Vector_impl_data._M_start) / 0x48)) {
    lVar6 = 0;
    local_90 = uVar5;
    for (__n = 0; pPVar1 = (local_88->
                           super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>).
                           _M_impl.super__Vector_impl_data._M_start,
        __n < (ulong)(((long)(local_88->
                             super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>).
                             _M_impl.super__Vector_impl_data._M_finish - (long)pPVar1) / 0x48);
        __n = __n + 1) {
      bVar3 = Bipartition::crosses
                        (&(local_98->
                          super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>)._M_impl
                          .super__Vector_impl_data._M_start[uVar5].super_Bipartition,
                         (Bipartition *)
                         ((long)&(pPVar1->super_Bipartition)._vptr_Bipartition + lVar6));
      pbVar4 = std::_Deque_iterator<bool,_bool_&,_bool_*>::operator[]
                         ((_Deque_iterator<bool,_bool_&,_bool_*> *)
                          ((long)&(local_a0->
                                  super__Vector_base<std::deque<bool,_std::allocator<bool>_>,_std::allocator<std::deque<bool,_std::allocator<bool>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start[uVar5].
                                  super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
                                  super__Deque_impl_data + 0x10),__n);
      *pbVar4 = bVar3;
      lVar6 = lVar6 + 0x48;
    }
    uVar5 = local_90 + 1;
  }
  return local_a0;
}

Assistant:

vector<deque<bool>> BipartiteGraph::getIncidenceMatrix(vector<PhyloTreeEdge>& edges1, vector<PhyloTreeEdge>& edges2) {
    std::vector<std::deque<bool>> incidenceMatrix(edges1.size(), std::deque<bool>(edges2.size(), false));
    for (size_t i = 0; i < edges1.size(); i++) {
        for (size_t j = 0; j < edges2.size(); j++) {
            incidenceMatrix[i][j] = edges1[i].crosses(edges2[j]);
        }
    }
    return incidenceMatrix;
}